

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
                *this)

{
  Layout LVar1;
  
  if (this->capacity_ != 0) {
    LVar1 = MakeLayout(this->capacity_);
    Deallocate<4ul,std::allocator<cs::signal_types>>
              ((allocator<cs::signal_types> *)&this->settings_,this->ctrl_,
               (LVar1.super_LayoutType<sizeof___(Ts),_signed_char,_cs::signal_types>.size_[0] + 3 &
               0xfffffffffffffffc) +
               LVar1.super_LayoutType<sizeof___(Ts),_signed_char,_cs::signal_types>.size_[1] * 4);
    this->ctrl_ = EmptyGroup()::empty_group;
    (this->settings_).
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>,_0UL,_false>
    .value = 0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

void destroy_slots()
			{
				if (!capacity_) return;
				for (size_t i = 0; i != capacity_; ++i) {
					if (IsFull(ctrl_[i])) {
						PolicyTraits::destroy(&alloc_ref(), slots_ + i);
					}
				}
				auto layout = MakeLayout(capacity_);
				// Unpoison before returning the memory to the allocator.
				SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
				Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
				ctrl_ = EmptyGroup();
				slots_ = nullptr;
				size_ = 0;
				capacity_ = 0;
				growth_left() = 0;
			}